

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinit.cpp
# Opt level: O2

void icu_63::initData(UErrorCode *status)

{
  ucnv_io_countKnownConverters_63(status);
  ucln_common_registerCleanup_63(UCLN_COMMON_UINIT,uinit_cleanup);
  return;
}

Assistant:

static void U_CALLCONV
initData(UErrorCode &status)
{
#if UCONFIG_ENABLE_PLUGINS
    /* initialize plugins */
    uplug_init(&status);
#endif

#if !UCONFIG_NO_CONVERSION
    /*
     * 2005-may-02
     *
     * ICU4C 3.4 (jitterbug 4497) hardcodes the data for Unicode character
     * properties for APIs that want to be fast.
     * Therefore, we need not load them here nor check for errors.
     * Instead, we load the converter alias table to see if any ICU data
     * is available.
     * Users should really open the service objects they need and check
     * for errors there, to make sure that the actual items they need are
     * available.
     */
    ucnv_io_countKnownConverters(&status);
#endif
    ucln_common_registerCleanup(UCLN_COMMON_UINIT, uinit_cleanup);
}